

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConvertToLHProcess.cpp
# Opt level: O1

void __thiscall Assimp::FlipUVsProcess::ProcessMaterial(FlipUVsProcess *this,aiMaterial *_mat)

{
  aiMaterialProperty *paVar1;
  char *pcVar2;
  int iVar3;
  Logger *this_00;
  ulong uVar4;
  
  if (_mat->mNumProperties != 0) {
    uVar4 = 0;
    do {
      paVar1 = _mat->mProperties[uVar4];
      if (paVar1 == (aiMaterialProperty *)0x0) {
        this_00 = DefaultLogger::get();
        Logger::debug(this_00,"Property is null");
      }
      else {
        iVar3 = strcmp((paVar1->mKey).data,"$tex.uvtrafo");
        if (iVar3 == 0) {
          if (paVar1->mDataLength < 0x14) {
            __assert_fail("prop->mDataLength >= sizeof(aiUVTransform)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/PostProcessing/ConvertToLHProcess.cpp"
                          ,0x134,"void Assimp::FlipUVsProcess::ProcessMaterial(aiMaterial *)");
          }
          pcVar2 = paVar1->mData;
          *(uint *)(pcVar2 + 4) = *(uint *)(pcVar2 + 4) ^ 0x80000000;
          *(uint *)(pcVar2 + 0x10) = *(uint *)(pcVar2 + 0x10) ^ 0x80000000;
        }
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 < _mat->mNumProperties);
  }
  return;
}

Assistant:

void FlipUVsProcess::ProcessMaterial (aiMaterial* _mat)
{
    aiMaterial* mat = (aiMaterial*)_mat;
    for (unsigned int a = 0; a < mat->mNumProperties;++a)   {
        aiMaterialProperty* prop = mat->mProperties[a];
        if( !prop ) {
            ASSIMP_LOG_DEBUG( "Property is null" );
            continue;
        }

        // UV transformation key?
        if (!::strcmp( prop->mKey.data, "$tex.uvtrafo"))    {
            ai_assert( prop->mDataLength >= sizeof(aiUVTransform));  /* something is wrong with the validation if we end up here */
            aiUVTransform* uv = (aiUVTransform*)prop->mData;

            // just flip it, that's everything
            uv->mTranslation.y *= -1.f;
            uv->mRotation *= -1.f;
        }
    }
}